

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::(anonymous_namespace)::
DatarateTestSVC_BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh_Test *this)

{
  *(undefined ***)(this + -0x18) = &PTR__DatarateTestSVC_01075ad8;
  *(undefined ***)(this + -8) = &PTR__DatarateTestSVC_01075cf0;
  *(undefined ***)this = &PTR__DatarateTestSVC_01075d10;
  if (*(void **)(this + 0x4b8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4b8));
  }
  *(undefined ***)this = &PTR__EncoderTest_01081d70;
  if (*(DatarateTestSVC_BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh_Test **)(this + 0x3a8) !=
      this + 0x3b8) {
    operator_delete(*(DatarateTestSVC_BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh_Test **)
                     (this + 0x3a8));
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x18));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x18));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SLMultiRefDropAllEnh) {
  BasicRateTargetingSVC3TL1SLMultiRefDropAllEnhTest();
}